

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O3

void __thiscall ProcessesView::onDataUpdated(ProcessesView *this)

{
  ulong uVar1;
  long lVar2;
  ProcessInfo *pPVar3;
  storage_type_conflict *psVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  QVector<ProcessInfo> *pQVar8;
  long *plVar9;
  long *plVar10;
  ulong uVar11;
  qsizetype *pqVar12;
  ulong uVar13;
  QString *pid_00;
  QStringView QVar14;
  QStringView QVar15;
  QString pid;
  anon_union_24_3_e3d07ef4_for_data local_b8;
  ProcessesView *local_98;
  QVector<ProcessInfo> *local_90;
  ulong local_88;
  QArrayData *local_80;
  storage_type_conflict *local_78;
  long local_70;
  ProcessInfo *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  QTreeView::setSortingEnabled(SUB81(this,0));
  pQVar8 = InfoProvider::getProcesses();
  plVar9 = (long *)QAbstractItemView::model();
  local_b8._forAlignment = -NAN;
  local_b8._8_8_ = 0;
  local_b8._16_8_ = 0;
  uVar5 = (**(code **)(*plVar9 + 0x78))(plVar9);
  if (0 < (int)uVar5) {
    uVar13 = (ulong)uVar5;
    local_98 = this;
    local_90 = pQVar8;
    do {
      uVar5 = (int)uVar13 - 1;
      local_88 = uVar13;
      plVar9 = (long *)QAbstractItemView::model();
      plVar10 = (long *)QAbstractItemView::model();
      local_60 = 0xffffffffffffffff;
      local_58 = 0;
      uStack_50 = 0;
      uVar13 = (ulong)uVar5;
      (**(code **)(*plVar10 + 0x60))(local_48,plVar10,uVar5,3,&local_60);
      (**(code **)(*plVar9 + 0x90))(&local_b8,plVar9,local_48,0);
      QVariant::toString();
      QVariant::~QVariant((QVariant *)&local_b8);
      lVar2 = local_70;
      psVar4 = local_78;
      uVar1 = (pQVar8->d).size;
      if (0 < (long)uVar1) {
        local_68 = (local_90->d).ptr;
        pqVar12 = &(local_68->pid).d.size;
        uVar11 = 0;
        do {
          if (*pqVar12 == lVar2) {
            QVar14.m_data = (char16_t *)pqVar12[-1];
            QVar14.m_size = lVar2;
            QVar15.m_data = psVar4;
            QVar15.m_size = lVar2;
            iVar6 = QtPrivate::compareStrings(QVar14,QVar15,CaseSensitive);
            pPVar3 = local_68;
            if (iVar6 == 0) {
              uVar11 = uVar11 & 0xffffffff;
              QVariant::QVariant((QVariant *)&local_b8,(QString *)&local_68[uVar11].type);
              updateItem(local_98,uVar5,1,(QVariant *)&local_b8);
              pQVar8 = local_90;
              QVariant::~QVariant((QVariant *)&local_b8);
              convertToInt((QVariant *)&local_b8,&pPVar3[uVar11].sm);
              this = local_98;
              updateItem(local_98,uVar5,5,(QVariant *)&local_b8);
              QVariant::~QVariant((QVariant *)&local_b8);
              convertToInt((QVariant *)&local_b8,&pPVar3[uVar11].mem);
              updateItem(this,uVar5,6,(QVariant *)&local_b8);
              QVariant::~QVariant((QVariant *)&local_b8);
              convertToInt((QVariant *)&local_b8,&pPVar3[uVar11].enc);
              updateItem(this,uVar5,7,(QVariant *)&local_b8);
              QVariant::~QVariant((QVariant *)&local_b8);
              convertToInt((QVariant *)&local_b8,&pPVar3[uVar11].dec);
              updateItem(this,uVar5,8,(QVariant *)&local_b8);
              QVariant::~QVariant((QVariant *)&local_b8);
              convertToInt((QVariant *)&local_b8,&pPVar3[uVar11].fbmem);
              updateItem(this,uVar5,4,(QVariant *)&local_b8);
              QVariant::~QVariant((QVariant *)&local_b8);
              goto LAB_00117d9c;
            }
          }
          uVar11 = uVar11 + 1;
          pqVar12 = pqVar12 + 0x1b;
        } while (uVar1 != uVar11);
      }
      this = local_98;
      plVar9 = (long *)QAbstractItemView::model();
      local_b8._forAlignment = -NAN;
      local_b8._8_8_ = 0;
      local_b8._16_8_ = 0;
      (**(code **)(*plVar9 + 0x108))(plVar9,uVar13,1,&local_b8);
      pQVar8 = local_90;
LAB_00117d9c:
      if (local_80 != (QArrayData *)0x0) {
        LOCK();
        (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_80,2,8);
        }
      }
    } while (1 < (int)local_88);
  }
  plVar9 = (long *)QAbstractItemView::model();
  local_b8._forAlignment = -NAN;
  local_b8._8_8_ = 0;
  local_b8._16_8_ = 0;
  iVar6 = (**(code **)(*plVar9 + 0x78))(plVar9);
  lVar2 = (pQVar8->d).size;
  if (lVar2 != 0) {
    pPVar3 = (pQVar8->d).ptr;
    local_88 = lVar2 * 0xd8;
    uVar13 = 0;
    do {
      pid_00 = (QString *)((long)&(pPVar3->pid).d.d + uVar13);
      iVar7 = getRowIndexByPid(this,pid_00);
      if (iVar7 == -1) {
        QVariant::QVariant((QVariant *)&local_b8,(QString *)((long)&(pPVar3->name).d.d + uVar13));
        addItem(this,iVar6,0,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        QVariant::QVariant((QVariant *)&local_b8,(QString *)((long)&(pPVar3->type).d.d + uVar13));
        addItem(this,iVar6,1,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,(QString *)((long)&(pPVar3->gpuIdx).d.d + uVar13));
        addItem(this,iVar6,2,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,pid_00);
        addItem(this,iVar6,3,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,(QString *)((long)&(pPVar3->sm).d.d + uVar13));
        addItem(this,iVar6,5,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,(QString *)((long)&(pPVar3->mem).d.d + uVar13));
        addItem(this,iVar6,6,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,(QString *)((long)&(pPVar3->enc).d.d + uVar13));
        addItem(this,iVar6,7,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,(QString *)((long)&(pPVar3->dec).d.d + uVar13));
        addItem(this,iVar6,8,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        convertToInt((QVariant *)&local_b8,(QString *)((long)&(pPVar3->fbmem).d.d + uVar13));
        addItem(this,iVar6,4,(QVariant *)&local_b8);
        QVariant::~QVariant((QVariant *)&local_b8);
        iVar6 = iVar6 + 1;
      }
      uVar13 = uVar13 + 0xd8;
    } while (local_88 != uVar13);
  }
  QTreeView::setSortingEnabled(SUB81(this,0));
  return;
}

Assistant:

void ProcessesView::onDataUpdated() {
    // In order to avoid performance and other issues, sorting will be enabled after inserting
    // and updating the items in the tree: https://doc.qt.io/qt-5/qtreeview.html#sortingEnabled-prop
    setSortingEnabled(false);

    const auto &processes = InfoProvider::getProcesses();

    // update existing processes list & remove finished processes
    // loop from more to less in order to delete rows
    for (int i = model()->rowCount() - 1; i >= 0; i--) {
        QString pid = model()->data(model()->index(i, NVSMColumns::PID)).toString();

        int index = -1;

        for (int j = 0; j < processes.size(); ++j) {
            if (processes[j].pid == pid) {
                index = j;
                break;
            }
        }

        if (index == -1) {
            model()->removeRow(i);
        } else {
            const ProcessInfo &processInfo = processes[index];

            // update what may change
            updateItem(i, NVSMColumns::Type, processInfo.type);
            updateItem(i, NVSMColumns::Sm, convertToInt(processInfo.sm));
            updateItem(i, NVSMColumns::Mem, convertToInt(processInfo.mem));
            updateItem(i, NVSMColumns::Enc, convertToInt(processInfo.enc));
            updateItem(i, NVSMColumns::Dec, convertToInt(processInfo.dec));
            updateItem(i, NVSMColumns::FbMem, convertToInt(processInfo.fbmem));
        }
    }

    // add new processes to the list, if there are any
    int rowCount = model()->rowCount();
    for (auto &process : processes) {
        if (getRowIndexByPid(process.pid) == -1) {
            addItem(rowCount, NVSMColumns::Name, process.name);
            addItem(rowCount, NVSMColumns::Type, process.type);
            addItem(rowCount, NVSMColumns::GPUIdx, convertToInt(process.gpuIdx));
            addItem(rowCount, NVSMColumns::PID, convertToInt(process.pid));
            addItem(rowCount, NVSMColumns::Sm, convertToInt(process.sm));
            addItem(rowCount, NVSMColumns::Mem, convertToInt(process.mem));
            addItem(rowCount, NVSMColumns::Enc, convertToInt(process.enc));
            addItem(rowCount, NVSMColumns::Dec, convertToInt(process.dec));
            addItem(rowCount, NVSMColumns::FbMem, convertToInt(process.fbmem));

            rowCount++;
        }
    }

    setSortingEnabled(true);
}